

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O0

node_t_conflict cond_expr(c2m_ctx_t c2m_ctx,int no_err_p)

{
  int iVar1;
  node_t_conflict pnVar2;
  undefined1 local_40 [8];
  pos_t pos;
  node_t_conflict n;
  node_t_conflict r;
  int no_err_p_local;
  c2m_ctx_t c2m_ctx_local;
  
  c2m_ctx_local = (c2m_ctx_t)lor_expr(c2m_ctx,no_err_p);
  if ((c2m_ctx_local != (c2m_ctx_t)&err_struct) &&
     (iVar1 = match(c2m_ctx,0x3f,(pos_t *)local_40,(node_code_t *)0x0,(node_t_conflict *)0x0),
     iVar1 != 0)) {
    pos._8_8_ = new_pos_node1(c2m_ctx,N_COND,_local_40,(node_t_conflict)c2m_ctx_local);
    pnVar2 = expr(c2m_ctx,no_err_p);
    if (pnVar2 == &err_struct) {
      c2m_ctx_local = (c2m_ctx_t)&err_struct;
    }
    else {
      op_append(c2m_ctx,(node_t_conflict)pos._8_8_,pnVar2);
      iVar1 = match(c2m_ctx,0x3a,(pos_t *)0x0,(node_code_t *)0x0,(node_t_conflict *)0x0);
      if (iVar1 == 0) {
        c2m_ctx_local = (c2m_ctx_t)&err_struct;
      }
      else {
        pnVar2 = cond_expr(c2m_ctx,no_err_p);
        if (pnVar2 == &err_struct) {
          c2m_ctx_local = (c2m_ctx_t)&err_struct;
        }
        else {
          op_append(c2m_ctx,(node_t_conflict)pos._8_8_,pnVar2);
          c2m_ctx_local = (c2m_ctx_t)pos._8_8_;
        }
      }
    }
  }
  return (node_t_conflict)c2m_ctx_local;
}

Assistant:

D (cond_expr) {
  node_t r, n;
  pos_t pos;

  P (lor_expr);
  if (!MP ('?', pos)) return r;
  n = new_pos_node1 (c2m_ctx, N_COND, pos, r);
  P (expr);
  op_append (c2m_ctx, n, r);
  if (!M (':')) return err_node;
  P (cond_expr);
  op_append (c2m_ctx, n, r);
  return n;
}